

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

optional<unsigned_long> __thiscall kratos::Simulator::get_value_(Simulator *this,Var *var)

{
  uint *puVar1;
  long *plVar2;
  pointer puVar3;
  Var *var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  uint32_t uVar9;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar10;
  __node_base_ptr p_Var11;
  mapped_type *pmVar12;
  __node_base_ptr p_Var13;
  mapped_type *__x;
  InternalException *pIVar14;
  _Storage<unsigned_long,_true> unaff_RBX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *unaff_R14;
  __hash_code __code;
  bool bVar15;
  optional<unsigned_long> oVar16;
  string_view format_str;
  format_args args;
  pointer local_a8;
  pointer ppStack_a0;
  undefined1 auStack_98 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  undefined1 auStack_78 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *local_58;
  Var *root;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  Var *var_local;
  
  if (((var == (Var *)0x0) ||
      (puVar1 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start,
      (long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 != 4)) || (1 < *puVar1)) {
LAB_0021721c:
    this = (Simulator *)unaff_RBX;
    unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)0x0;
    goto LAB_0021721f;
  }
  result.
  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._24_8_
       = var;
  switch(var->type_) {
  case Expression:
    eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&root,this,
              var);
    if (result.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload.field2[0x10] == '\x01') {
      this = (Simulator *)(root->super_IRNode)._vptr_IRNode;
      unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)CONCAT71((int7)((ulong)&root >> 8),1);
    }
    else {
      unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)0x0;
    }
    if (result.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload.field2[0x10] == '\0') goto LAB_0021721f;
    result.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload.field2[0x10] = 0;
    auVar4 = (undefined1  [8])root;
    break;
  case Slice:
    iVar7 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    local_58 = (Var *)CONCAT44(extraout_var,iVar7);
    auStack_98 = (undefined1  [8])0x0;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((local_58->type_ == Parameter) || (local_58->type_ == ConstValue)) {
      oVar16 = get_value_(this,(Var *)result.
                                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._24_8_);
      root = oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
      if (((undefined1  [16])
           oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        (**(code **)(*(long *)result.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._24_8_ + 0x100))(auStack_78);
        local_a8 = (pointer)auStack_78;
        ppStack_a0 = index.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x1b;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_a8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&root,(detail *)"Unable to get value for {0}",format_str,args);
        InternalException::InternalException(pIVar14,(string *)&root);
        __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long_const*>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_98,&root);
LAB_002172ed:
      get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)auStack_78,this,
                      (Var *)result.
                             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             ._24_8_);
      if (auStack_78 ==
          (undefined1  [8])
          index.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)0x0;
      }
      else {
        pVar10 = compute_var_high_low
                           (local_58,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      *)auStack_78);
        uVar6 = (*(local_58->super_IRNode)._vptr_IRNode[7])();
        if (uVar6 < (pVar10.first - pVar10.second) + 1) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          root = (Var *)&result.
                         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&root,"Unable to resolve variable slicing","");
          InternalException::InternalException(pIVar14,(string *)&root);
          __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar6 = local_58->var_width_;
        this = (Simulator *)
               (~(-1L << ((char)(((ulong)pVar10 & 0xffffffff) % (ulong)uVar6) + 1U & 0x3f)) &
               (ulong)(&((IRNode *)auStack_98)->_vptr_IRNode)
                      [((ulong)pVar10 >> 0x20) / (ulong)uVar6] >>
               ((byte)(((ulong)pVar10 >> 0x20) % (ulong)uVar6) & 0x3f));
        unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
      }
      auVar4 = auStack_98;
      result.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78,
                        (long)index.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
        auVar4 = auStack_98;
        result.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
    }
    else {
      puVar3 = (local_58->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((long)(local_58->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 == 4) && (*puVar3 == 1)) {
        oVar16 = get_value_(this,local_58);
        unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)(ulong)oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._8_4_;
        if ((((undefined1  [16])
              oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) &&
           (root = (Var *)oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_payload,
           std::vector<unsigned_long,std::allocator<unsigned_long>>::
           _M_assign_aux<unsigned_long_const*>
                     ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_98,&root),
           ((undefined1  [16])
            oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
           (undefined1  [16])0x0)) goto LAB_002172ed;
      }
      else {
        unaff_R14 = &this->complex_values_;
        p_Var13 = std::
                  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_before_node
                            (&unaff_R14->_M_h,
                             (ulong)local_58 % (this->complex_values_)._M_h._M_bucket_count,
                             &local_58,(__hash_code)local_58);
        if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
          __x = std::__detail::
                _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)unaff_R14,&local_58);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_98,__x);
          goto LAB_002172ed;
        }
      }
      unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)0x0;
      auVar4 = auStack_98;
      result.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    break;
  case ConstValue:
    if (*(int *)&var[1].super_IRNode.comment._M_dataplus._M_p != 0) {
      pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
      (*(var->super_IRNode)._vptr_IRNode[0x1f])(auStack_78,var);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root,
                     "Big number evaluation not supported. Got ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78
                    );
      InternalException::InternalException(pIVar14,(string *)&root);
      __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  case Parameter:
    this = (Simulator *)((_Storage<unsigned_long,_true> *)(var + 1))->_M_value;
LAB_00217392:
    unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
    goto LAB_0021721f;
  default:
    iVar7 = (*(var->super_IRNode)._vptr_IRNode[0x1c])(var);
    uVar5 = result.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._24_8_;
    unaff_RBX = (_Storage<unsigned_long,_true>)this;
    if ((char)iVar7 != '\0') {
      plVar2 = *(long **)(result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._24_8_ + 0x270);
      uVar8 = (**(code **)(*plVar2 + 0x80))(plVar2);
      if ((char)uVar8 == '\0') {
        bVar15 = false;
      }
      else {
        root = (Var *)&result.
                       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._M_payload._M_value.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&root,plVar2[0x1d],plVar2[0x1e] + plVar2[0x1d]);
        iVar7 = std::__cxx11::string::compare((char *)&root);
        bVar15 = iVar7 == 0;
        if (root != (Var *)((long)&result.
                                   super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   ._M_payload + 8)) {
          operator_delete(root,(long)result.
                                     super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     ._M_payload._M_value.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
      }
      if (bVar15) {
        var_00 = *(Var **)(*(long *)(uVar5 + 0x290) + 0x40);
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   (*(long *)(uVar5 + 0x290) + 0x48);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        oVar16 = get_value_(this,var_00);
        if (((undefined1  [16])
             oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          uVar9 = clog2(oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_payload._0_4_);
          this._4_4_ = 0;
          this._0_4_ = uVar9;
          unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)CONCAT71((uint7)(uint3)((uint)uVar8 >> 8),1);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          goto LAB_0021721f;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      goto LAB_0021721c;
    }
    unaff_R14 = (unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)0x0;
    p_Var11 = std::
              _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_find_before_node
                        ((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)this,(ulong)result.
                                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        ._24_8_ % (this->values_)._M_h._M_bucket_count,
                         (key_type *)
                         &result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_engaged,
                         result.
                         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._24_8_);
    if (p_Var11 == (__node_base_ptr)0x0) goto LAB_0021721f;
    if (p_Var11->_M_nxt == (_Hash_node_base *)0x0) goto LAB_0021721c;
    pmVar12 = std::__detail::
              _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this,(key_type *)
                           &result.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_engaged);
    this = (Simulator *)*pmVar12;
    goto LAB_00217392;
  }
  if (auVar4 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar4,
                    (long)result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auVar4);
  }
LAB_0021721f:
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = (ulong)unaff_R14 & 0xffffffff;
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)(_Storage<unsigned_long,_true>)this;
  return (optional<unsigned_long>)
         oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Simulator::get_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    // only scalar
    if (var->size().size() != 1 || var->size().front() > 1) return std::nullopt;

    if (var->type() == VarType::Parameter) {
        auto const *param = reinterpret_cast<const Param *>(var);
        return param->value();
    } else if (var->type() == VarType::ConstValue) {
        auto const *const_ = reinterpret_cast<const Const *>(var);
        if (const_->is_bignum())
            throw InternalException("Big number evaluation not supported. Got " +
                                    const_->to_string());
        return const_->value();
    } else if (var->type() == VarType::Expression) {
        auto result = eval_expr(var);
        if (result) {
            return (*result)[0];
        } else {
            return std::nullopt;
        }
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            auto value = get_value_(var);
            if (!value)
                throw InternalException(
                    ::format("Unable to get value for {0}", var->handle_name()));
            values = {*value};
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            auto value = get_value_(root);
            if (!value) return std::nullopt;
            values = {*value};
        } else if (complex_values_.find(root) == complex_values_.end()) {
            return std::nullopt;
        } else {
            values = complex_values_.at(root);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        auto low = var_low % root->var_width();
        auto high = var_high % root->var_width();
        auto value = values[base];
        return (value >> low) & (~(0xFFFFFFFFFFFFFFFF << (high + 1)));
    } else {
        // function call
        if (var->is_function()) {
            // only built-in function that can be statically evaluated is supported
            auto const *func_call_car = reinterpret_cast<const FunctionCallVar *>(var);
            auto *def = func_call_car->func();
            if (def->is_builtin() && def->function_name() == "clog2") {
                auto arg = func_call_car->args().begin()->second;
                auto v = get_value_(arg.get());
                if (v) return clog2(*v);
            }
            return std::nullopt;

        } else {
            if (values_.find(var) == values_.end())
                return std::nullopt;
            else
                return values_.at(var);
        }
    }
}